

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::InvalidateProtoInlineCaches(ThreadContext *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *this_00;
  char16 *pcVar2;
  InlineCacheList *local_20;
  InlineCacheList *inlineCacheList;
  ThreadContext *pTStack_10;
  PropertyId propertyId_local;
  ThreadContext *this_local;
  
  inlineCacheList._4_4_ = propertyId;
  pTStack_10 = this;
  bVar1 = JsUtil::
          BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    (&this->protoInlineCacheByPropId,(int *)((long)&inlineCacheList + 4),&local_20);
  if (bVar1) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TraceInlineCacheInvalidationPhase);
    if (bVar1) {
      this_00 = GetPropertyName(this,inlineCacheList._4_4_);
      pcVar2 = Js::PropertyRecord::GetBuffer(this_00);
      Output::Print(L"InlineCacheInvalidation: invalidating proto caches for property %s(%u)\n",
                    pcVar2,(ulong)inlineCacheList._4_4_);
      Output::Flush();
    }
    InvalidateAndDeleteInlineCacheList(this,local_20);
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateProtoInlineCaches(Js::PropertyId propertyId)
{
    InlineCacheList* inlineCacheList;
    if (protoInlineCacheByPropId.TryGetValueAndRemove(propertyId, &inlineCacheList))
    {
        if (PHASE_TRACE1(Js::TraceInlineCacheInvalidationPhase))
        {
            Output::Print(_u("InlineCacheInvalidation: invalidating proto caches for property %s(%u)\n"),
                GetPropertyName(propertyId)->GetBuffer(), propertyId);
            Output::Flush();
        }

        InvalidateAndDeleteInlineCacheList(inlineCacheList);
    }
}